

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemExpr_RefFunc
          (SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  Index local_74;
  Var local_70;
  
  RVar1 = CheckType(this,loc,(Type)0xfffffffffffffff0,
                    (this->elems_).
                    super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].element,"elem expression");
  Var::Var(&local_70,func_var);
  RVar2 = CheckFuncIndex(this,&local_70,(FuncType *)0x0);
  Var::~Var(&local_70);
  if (func_var->type_ == Index) {
    local_74 = (func_var->field_2).index_;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,&local_74);
    return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                ,0x3a,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnElemSegmentElemExpr_RefFunc(const Location& loc,
                                                      Var func_var) {
  Result result = Result::Ok;
  result |=
      CheckType(loc, Type::FuncRef, elems_.back().element, "elem expression");
  result |= CheckFuncIndex(func_var);
  declared_funcs_.insert(func_var.index());
  return result;
}